

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

Move * ddSymmSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  uint uVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  DdSubtable *pDVar4;
  int iVar5;
  int iVar6;
  DdHalfWord y;
  DdHalfWord x_01;
  int iVar7;
  int iVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int local_68;
  DdNode *local_48;
  long local_40;
  long local_38;
  
  local_48 = (DdNode *)0x0;
  x_00 = table->invperm[x];
  uVar1 = table->subtables[x].next;
  iVar5 = table->keys - table->isolated;
  local_68 = 0;
  if ((int)uVar1 < xHigh) {
    lVar12 = (long)xHigh;
    lVar11 = lVar12 * 0xe + 4;
    local_68 = 0;
    do {
      iVar7 = table->invperm[lVar12];
      if ((iVar7 == x_00) || (iVar6 = cuddTestInteract(table,x_00,iVar7), iVar6 != 0)) {
        local_68 = (local_68 - (uint)(table->vars[iVar7]->ref == 1)) +
                   *(int *)((long)&table->subtables->nodelist + lVar11 * 4);
      }
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0xe;
    } while ((int)uVar1 < lVar12);
  }
  y = cuddNextHigh(table,x);
  if ((xHigh < (int)y) || (iVar7 = iVar5, local_68 < 1)) {
    return (Move *)0x0;
  }
  do {
    pDVar4 = table->subtables;
    local_38 = (long)(int)y;
    local_40 = local_38 * 0x38;
    DVar2 = pDVar4[local_38].next;
    DVar3 = DVar2;
    do {
      x_01 = DVar3;
      lVar11 = (long)(int)x_01;
      DVar3 = pDVar4[lVar11].next;
    } while (pDVar4[lVar11].next != y);
    iVar6 = cuddSymmCheck(table,x,y);
    DVar3 = pDVar4[x].next;
    if (iVar6 == 0) {
      if ((DVar3 == x) && (DVar2 == y)) {
        iVar7 = table->invperm[local_38];
        iVar6 = cuddTestInteract(table,x_00,iVar7);
        if (iVar6 != 0) {
          local_68 = (local_68 + (uint)(table->vars[iVar7]->ref == 1)) -
                     *(int *)((long)&table->subtables->keys + local_40);
        }
        iVar7 = cuddSwapInPlace(table,x,y);
        if ((iVar7 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_00924999:
          if (local_48 == (DdNode *)0x0) {
            return (Move *)0x1;
          }
          pDVar9 = table->nextFree;
          do {
            pDVar10 = local_48;
            local_48 = (pDVar10->type).kids.T;
            pDVar10->ref = 0;
            pDVar10->next = pDVar9;
            pDVar9 = pDVar10;
          } while (local_48 != (DdNode *)0x0);
          table->nextFree = pDVar10;
          return (Move *)0x1;
        }
        pDVar9->index = x;
        pDVar9->ref = y;
        *(int *)((long)&pDVar9->next + 4) = iVar7;
        (pDVar9->type).kids.T = local_48;
        if ((double)iVar5 * table->maxGrowth < (double)iVar7) {
          return (Move *)pDVar9;
        }
        local_48 = pDVar9;
        if (iVar7 < iVar5) {
          iVar5 = iVar7;
        }
      }
      else {
        lVar12 = (long)(int)DVar3;
        lVar13 = lVar12 * 0xe + 0x12;
        do {
          iVar7 = table->invperm[lVar12 + 1];
          if ((iVar7 == x_00) || (iVar6 = cuddTestInteract(table,x_00,iVar7), iVar6 != 0)) {
            local_68 = (local_68 + (uint)(table->vars[iVar7]->ref == 1)) -
                       *(int *)((long)&table->subtables->nodelist + lVar13 * 4);
          }
          lVar12 = lVar12 + 1;
          lVar13 = lVar13 + 0xe;
        } while (lVar12 < lVar11);
        iVar7 = ddSymmGroupMove(table,x,y,(Move **)&local_48);
        if (iVar7 == 0) goto LAB_00924999;
        if ((double)iVar5 * table->maxGrowth < (double)iVar7) {
          return (Move *)local_48;
        }
        if (iVar7 < iVar5) {
          iVar5 = iVar7;
        }
        uVar1 = table->subtables[lVar11].next;
        lVar12 = (long)(int)uVar1;
        if ((int)uVar1 < (int)x_01) {
          lVar13 = lVar12 * 0xe + 0x12;
          do {
            iVar6 = table->invperm[lVar12 + 1];
            if ((iVar6 == x_00) || (iVar8 = cuddTestInteract(table,x_00,iVar6), iVar8 != 0)) {
              local_68 = (local_68 - (uint)(table->vars[iVar6]->ref == 1)) +
                         *(int *)((long)&table->subtables->nodelist + lVar13 * 4);
            }
            lVar12 = lVar12 + 1;
            lVar13 = lVar13 + 0xe;
          } while (lVar11 != lVar12);
        }
      }
    }
    else {
      pDVar4[x].next = y;
      pDVar4[lVar11].next = DVar3;
    }
    y = cuddNextHigh(table,x_01);
    if (xHigh < (int)y) {
      return (Move *)local_48;
    }
    x = x_01;
    if (iVar5 <= iVar7 - local_68) {
      return (Move *)local_48;
    }
  } while( true );
}

Assistant:

static Move *
ddSymmSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move *moves;
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(moves);

ddSymmSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}